

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::anon_unknown_0::CopyBlitImage::CopyImplementation::recordCopyCommand
          (CopyImplementation *this,VkCommandBuffer cmdBuffer)

{
  deUint64 dVar1;
  DeviceInterface *pDVar2;
  ImageResource *pIVar3;
  Image *pIVar4;
  VkImage *pVVar5;
  DeviceInterface *vk;
  VkCommandBuffer cmdBuffer_local;
  CopyImplementation *this_local;
  
  pDVar2 = OperationContext::getDeviceInterface((this->super_ImplementationBase).m_context);
  if ((this->super_ImplementationBase).m_mode == ACCESS_MODE_READ) {
    pIVar3 = Resource::getImage((this->super_ImplementationBase).m_resource);
    dVar1 = (pIVar3->handle).m_internal;
    pIVar4 = de::details::
             UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
             ::operator*(&(this->super_ImplementationBase).m_image.
                          super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                        );
    pVVar5 = synchronization::Image::operator*(pIVar4);
    (*pDVar2->_vptr_DeviceInterface[0x60])
              (pDVar2,cmdBuffer,dVar1,6,pVVar5->m_internal,7,1,&this->m_imageCopyRegion);
  }
  else {
    pIVar4 = de::details::
             UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
             ::operator*(&(this->super_ImplementationBase).m_image.
                          super_UniqueBase<vkt::synchronization::Image,_de::DefaultDeleter<vkt::synchronization::Image>_>
                        );
    pVVar5 = synchronization::Image::operator*(pIVar4);
    dVar1 = pVVar5->m_internal;
    pIVar3 = Resource::getImage((this->super_ImplementationBase).m_resource);
    (*pDVar2->_vptr_DeviceInterface[0x60])
              (pDVar2,cmdBuffer,dVar1,6,(pIVar3->handle).m_internal,7,1,&this->m_imageCopyRegion);
  }
  return;
}

Assistant:

void recordCopyCommand (const VkCommandBuffer cmdBuffer)
	{
		const DeviceInterface&	vk	= m_context.getDeviceInterface();

		if (m_mode == ACCESS_MODE_READ)
		{
			// Resource Image -> Staging image
			vk.cmdCopyImage(cmdBuffer, m_resource.getImage().handle, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, **m_image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &m_imageCopyRegion);
		}
		else
		{
			// Staging image -> Resource Image
			vk.cmdCopyImage(cmdBuffer, **m_image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, m_resource.getImage().handle, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &m_imageCopyRegion);
		}
	}